

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> * __thiscall
nonius::benchmark::prepare<std::chrono::_V2::system_clock>
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,benchmark *this,configuration cfg,parameters params,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env)

{
  int iVar1;
  undefined4 extraout_var;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_RCX;
  int *in_RDX;
  double dVar2;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
  TVar3;
  benchmark_function local_b0;
  _Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false> local_a8;
  double local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_60,in_RCX);
  detail::benchmark_function::operator()((benchmark_function *)&local_a8,(parameters *)&this->fun);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  local_a0 = (double)cfg._0_8_ * 1000.0;
  dVar2 = 100000000.0;
  if (100000000.0 <= local_a0) {
    dVar2 = local_a0;
  }
  TVar3 = detail::
          run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::benchmark_function&>
                    ((parameters *)in_RCX,(Duration<std::chrono::_V2::system_clock>)(long)dVar2,1,
                     (benchmark_function *)&local_a8);
  local_a0 = ceil((local_a0 * (double)TVar3.iterations) / (double)TVar3.elapsed.__r.__r);
  iVar1 = *in_RDX;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_98,in_RCX);
  local_b0.f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl._0_4_ =
       (*(local_a8._M_head_impl)->_vptr_concept[2])();
  local_b0.f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl._4_4_ =
       extraout_var;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::execution_plan
            (__return_storage_ptr__,(int)local_a0,
             (duration<double,_std::ratio<1L,_1000000000L>_>)
             (double)((TVar3.elapsed.__r.__r / (TVar3._8_8_ >> 0x20)) * (long)iVar1 *
                     (long)(int)local_a0),(parameters *)&local_98,&local_b0,
             (duration<double,_std::ratio<1L,_1000000000L>_>)0x4197d78400000000,10000);
  if (local_b0.f._M_t.
      super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
      ._M_t.
      super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
      .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl !=
      (__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_b0.f._M_t.
                          super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                          .
                          super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>
                          ._M_head_impl + 0x20))();
  }
  local_b0.f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl =
       (unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
        )(__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
          )0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_98);
  if (local_a8._M_head_impl != (concept *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_concept[4])();
  }
  return __return_storage_ptr__;
}

Assistant:

execution_plan<FloatDuration<Clock>> prepare(configuration cfg, parameters params, environment<FloatDuration<Clock>> env) const {
            auto bench = fun(params);
            auto min_time = env.clock_resolution.mean * detail::minimum_ticks;
            auto run_time = std::max(min_time, chrono::duration_cast<decltype(min_time)>(detail::warmup_time));
            auto&& test = detail::run_for_at_least<Clock>(params, chrono::duration_cast<Duration<Clock>>(run_time), 1, bench);
            int new_iters = static_cast<int>(std::ceil(min_time * test.iterations / test.elapsed));
            return { new_iters, test.elapsed / test.iterations * new_iters * cfg.samples, params, bench, chrono::duration_cast<FloatDuration<Clock>>(detail::warmup_time), detail::warmup_iterations };
        }